

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

void resolve_iffeature_getsizes(lys_iffeature *iffeat,uint *expr_size,uint *feat_size)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int local_2c;
  uint uStack_28;
  uint8_t op;
  uint r;
  uint f;
  uint e;
  uint *feat_size_local;
  uint *expr_size_local;
  lys_iffeature *iffeat_local;
  
  r = 0;
  uStack_28 = 0;
  local_2c = 0;
  if (iffeat == (lys_iffeature *)0x0) {
    __assert_fail("iffeat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x4fe,
                  "void resolve_iffeature_getsizes(struct lys_iffeature *, unsigned int *, unsigned int *)"
                 );
  }
  if (iffeat->expr != (uint8_t *)0x0) {
    do {
      uVar2 = r + 1;
      bVar1 = iff_getop(iffeat->expr,r);
      uVar3 = (uint)bVar1;
      if (uVar3 == 0) {
        if (local_2c == 0) {
          local_2c = 1;
        }
      }
      else if (uVar3 - 1 < 2) {
        if (local_2c == 0) {
          local_2c = 2;
        }
        else {
          local_2c = local_2c + 1;
        }
      }
      else if ((uVar3 == 3) && (uStack_28 = uStack_28 + 1, local_2c != 0)) {
        local_2c = local_2c + -1;
      }
      r = uVar2;
    } while (local_2c != 0);
  }
  if (expr_size != (uint *)0x0) {
    *expr_size = r;
  }
  if (feat_size != (uint *)0x0) {
    *feat_size = uStack_28;
  }
  return;
}

Assistant:

void
resolve_iffeature_getsizes(struct lys_iffeature *iffeat, unsigned int *expr_size, unsigned int *feat_size)
{
    unsigned int e = 0, f = 0, r = 0;
    uint8_t op;

    assert(iffeat);

    if (!iffeat->expr) {
        goto result;
    }

    do {
        op = iff_getop(iffeat->expr, e++);
        switch (op) {
        case LYS_IFF_NOT:
            if (!r) {
                r += 1;
            }
            break;
        case LYS_IFF_AND:
        case LYS_IFF_OR:
            if (!r) {
                r += 2;
            } else {
                r += 1;
            }
            break;
        case LYS_IFF_F:
            f++;
            if (r) {
                r--;
            }
            break;
        }
    } while(r);

result:
    if (expr_size) {
        *expr_size = e;
    }
    if (feat_size) {
        *feat_size = f;
    }
}